

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool getBit(FILE *f)

{
  undefined8 in_RAX;
  char cVar1;
  uchar uVar2;
  uchar check;
  
  check = (uchar)((ulong)in_RAX >> 0x38);
  if (((getBit::count == '\0') && (fread(&getBit::buf,1,1,(FILE *)f), getBit::buf == 0xff)) &&
     (fread(&check,1,1,(FILE *)f), check != '\0')) {
    fwrite(anon_var_dwarf_3036,0x22,1,_stderr);
  }
  uVar2 = getBit::count + '\x01';
  cVar1 = getBit::count + 0xf9;
  if (cVar1 == '\0') {
    uVar2 = '\0';
  }
  getBit::count = uVar2;
  return (getBit::buf >> ((byte)-cVar1 & 0x1f) & 1) != 0;
}

Assistant:

bool getBit(FILE *f) {
    static unsigned char buf;
    static unsigned char count = 0;
    if (count == 0) {
        fread(&buf, 1, 1, f);
        if (buf == 0xFF) {
            unsigned char check;
            fread(&check, 1, 1, f);
            if (check != 0x00) {
                fprintf(stderr, "data 段有不是 0xFF00 的數據");
            }
        }
    }
    bool ret = buf & (1 << (7 - count));
    count = (count == 7 ? 0 : count + 1);
    return ret;
}